

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<double>_> *this,void **vtt,
          TPZBlockDiagonal<std::complex<double>_> *A)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(A->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(A);
  iVar2 = (*(A->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(A);
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow =
       CONCAT44(extraout_var,iVar1);
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol =
       CONCAT44(extraout_var_00,iVar2);
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  TPZVec<std::complex<double>_>::TPZVec(&this->fStorage,&A->fStorage);
  TPZVec<long>::TPZVec(&this->fBlockPos,&A->fBlockPos);
  TPZVec<int>::TPZVec(&this->fBlockSize,&A->fBlockSize);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal (const TPZBlockDiagonal<TVar> & A)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>( A.Dim(), A.Dim() ), fStorage(A.fStorage),
fBlockPos(A.fBlockPos), fBlockSize(A.fBlockSize)
{
}